

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O0

void __thiscall cppurses::Event_loop::run_async(Event_loop *this)

{
  future<int> local_20;
  Event_loop *local_10;
  Event_loop *this_local;
  
  local_10 = this;
  std::async<cppurses::Event_loop::run_async()::__0>((launch)&local_20,(type *)0x1);
  std::future<int>::operator=(&this->fut_,&local_20);
  std::future<int>::~future(&local_20);
  return;
}

Assistant:

auto Event_loop::run_async() -> void
{
    fut_ = std::async(std::launch::async, [this] { return this->run(); });
}